

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartHelper.h
# Opt level: O2

string * __thiscall
Imf_3_2::MultiViewChannelName::getLayer_abi_cxx11_
          (string *__return_storage_ptr__,MultiViewChannelName *this)

{
  long lVar1;
  allocator<char> local_11;
  
  lVar1 = std::__cxx11::string::rfind((char)this,0x2e);
  if (lVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_11);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getLayer () const
    {
        std::size_t q = name.rfind ('.');
        if (q == name.npos) { return ""; }
        return name.substr (0, q);
    }